

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O3

void __thiscall DROPlayer::ScanInitBlock(DROPlayer *this)

{
  ulong *puVar1;
  ushort uVar2;
  uint uVar3;
  UINT32 UVar4;
  UINT32 UVar5;
  UINT8 *pUVar6;
  byte bVar7;
  ushort uVar8;
  byte bVar9;
  ulong *puVar10;
  ulong uVar11;
  
  puVar10 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar1 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar3 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (puVar10 != puVar1) {
    memset(puVar10,0,(long)puVar1 - (long)puVar10);
    puVar10 = puVar1;
  }
  if (uVar3 != 0) {
    *puVar10 = *puVar10 & ~(0xffffffffffffffffU >> (-(char)uVar3 & 0x3fU));
  }
  this->_initOPL3Enable = '\0';
  uVar11 = (ulong)(this->_fileHdr).dataOfs;
  uVar8 = (this->_fileHdr).verMajor;
  uVar3 = DataLoader_GetSize(this->_dLoad);
  if (uVar8 < 2) {
    bVar9 = 0;
    uVar8 = 0;
    for (; (uint)uVar11 < uVar3; uVar11 = (ulong)((int)uVar11 + 2)) {
      pUVar6 = this->_fileData;
      bVar7 = pUVar6[uVar11];
      if ((bVar7 & 0xfe) == 2) {
        do {
          bVar9 = bVar7;
          uVar11 = uVar11 + 1;
          UVar4 = DataLoader_GetSize(this->_dLoad);
          if (UVar4 <= uVar11) {
            bVar9 = bVar9 & 1;
            goto LAB_0010d194;
          }
          pUVar6 = this->_fileData;
          bVar7 = pUVar6[uVar11];
        } while ((bVar7 & 0xfe) == 2);
        bVar9 = bVar9 & 1;
      }
      uVar2 = CONCAT11(bVar9,bVar7);
      if (uVar2 < uVar8) break;
      puVar10 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar2 >> 6);
      *puVar10 = *puVar10 | 1L << (bVar7 & 0x3f);
      if (uVar2 == 0x105) {
        this->_initOPL3Enable = pUVar6[uVar11 + 1];
      }
      uVar3 = DataLoader_GetSize(this->_dLoad);
      uVar8 = uVar2;
    }
LAB_0010d194:
    UVar5 = DataLoader_GetSize(this->_dLoad);
    UVar4 = (UINT32)uVar11;
    if (UVar4 < UVar5) {
      uVar11 = uVar11 & 0xffffffff;
      do {
        while( true ) {
          pUVar6 = this->_fileData;
          UVar4 = (UINT32)uVar11;
          bVar7 = pUVar6[uVar11];
          if (bVar7 < 2) goto LAB_0010d24b;
          if ((bVar7 & 0xfe) == 2) break;
          if ((bVar7 == 4) && (pUVar6[UVar4 + 1] < 8)) goto LAB_0010d24b;
          puVar10 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                    (ushort)(CONCAT11(bVar9,bVar7) >> 6);
          *puVar10 = *puVar10 | 1L << (bVar7 & 0x3f);
          if (CONCAT11(bVar9,bVar7) == 0x105) {
            this->_initOPL3Enable = pUVar6[UVar4 + 1];
          }
          UVar4 = UVar4 + 2;
          uVar11 = (ulong)UVar4;
          UVar5 = DataLoader_GetSize(this->_dLoad);
          if (UVar5 <= UVar4) goto LAB_0010d24b;
        }
        bVar9 = bVar7 & 1;
        uVar11 = (ulong)(UVar4 + 1);
        UVar5 = DataLoader_GetSize(this->_dLoad);
      } while (UVar4 + 1 < UVar5);
      UVar4 = UVar4 + 1;
    }
  }
  else {
    while (UVar4 = (UINT32)uVar11, UVar4 < uVar3) {
      pUVar6 = this->_fileData;
      bVar9 = pUVar6[uVar11];
      if ((bVar9 == (this->_fileHdr).cmdDlyShort) || (bVar9 == (this->_fileHdr).cmdDlyLong)) break;
      if ((uint)(this->_fileHdr).regCmdCnt <= (bVar9 & 0x7f)) break;
      bVar7 = (this->_fileHdr).regCmdMap[bVar9 & 0x7f];
      uVar3 = (uint)bVar7 + (bVar9 & 0xffffff80) * 2;
      puVar10 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar3 >> 6);
      *puVar10 = *puVar10 | 1L << (bVar7 & 0x3f);
      if (uVar3 == 0x105) {
        this->_initOPL3Enable = pUVar6[UVar4 + 1];
      }
      uVar3 = DataLoader_GetSize(this->_dLoad);
      uVar11 = (ulong)(UVar4 + 2);
    }
  }
LAB_0010d24b:
  this->_initBlkEndOfs = UVar4;
  return;
}

Assistant:

void DROPlayer::ScanInitBlock(void)
{
	// Scan initialization block of the DRO in order to be able to apply special fixes.
	// Fixes like:
	//	- DualOPL2 vs. OPL3 detection (because DOSBox sets hwType to DualOPL2 more often that it should)
	//	- [DRO v1] detect size of initialization block (for filtering out unescaped writes to register 01/04)
	UINT32 filePos;
	UINT8 curCmd;
	UINT8 selPort;
	UINT16 curReg;
	UINT16 lastReg;
	
	std::fill(_initRegSet.begin(), _initRegSet.end(), false);
	_initOPL3Enable = 0x00;
	
	filePos = _fileHdr.dataOfs;
	if (_fileHdr.verMajor < 2)
	{
		selPort = 0;
		lastReg = 0x000;
		// The file begins with a register dump with increasing register numbers.
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			if (curCmd == 0x02 || curCmd == 0x03)
			{
				// make an exception for the chip select commands
				selPort = curCmd & 0x01;
				filePos ++;
				continue;
			}
			
			curReg = (selPort << 8) | (curCmd << 0);
			if (curReg < lastReg)
				break;
			
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			lastReg = curReg;
			filePos += 0x02;
		}
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			
			if (curCmd == 0x00 || curCmd == 0x01)
				break;	// delay command - stop scanning
			if (curCmd == 0x02 || curCmd == 0x03)
			{
				selPort = curCmd & 0x01;
				filePos ++;
				continue;
			}
			if (curCmd == 0x04)
			{
				if (_fileData[filePos + 0x01] < 0x08)
					break;	// properly escaped command - stop scanning
			}
			curReg = (selPort << 8) | (curCmd << 0);
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			filePos += 0x02;
		}
	}
	else //if (_fileHdr.verMajor == 2)
	{
		lastReg = 0x000;
		// The file begins with a register dump with increasing register numbers.
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			if (curCmd == _fileHdr.cmdDlyShort || curCmd == _fileHdr.cmdDlyLong)
				break;
			
			if ((curCmd & 0x7F) >= _fileHdr.regCmdCnt)
				break;
			curReg = ((curCmd & 0x80) << 1) | (_fileHdr.regCmdMap[curCmd & 0x7F] << 0);
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			filePos += 0x02;
		}
	}
	_initBlkEndOfs = filePos;
	
	return;
}